

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveFieldLiteGenerator::GenerateInterfaceMembers
          (ImmutablePrimitiveFieldLiteGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  bool bVar2;
  string_view begin_varname;
  string_view text;
  string_view text_00;
  string_view end_varname;
  Options local_c0;
  Options local_70;
  
  bVar2 = FieldDescriptor::has_presence(this->descriptor_);
  if (bVar2) {
    pFVar1 = this->descriptor_;
    Options::Options(&local_70,&this->context_->options_);
    WriteFieldAccessorDocComment(printer,pFVar1,HAZZER,&local_70,false,false,false);
    Options::~Options(&local_70);
    text._M_str = "$deprecation$boolean has$capitalized_name$();\n";
    text._M_len = 0x2e;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&this->variables_,text);
  }
  pFVar1 = this->descriptor_;
  Options::Options(&local_c0,&this->context_->options_);
  WriteFieldAccessorDocComment(printer,pFVar1,GETTER,&local_c0,false,false,false);
  Options::~Options(&local_c0);
  text_00._M_str = "$deprecation$$type$ ${$get$capitalized_name$$}$();\n";
  text_00._M_len = 0x33;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,text_00);
  begin_varname._M_str = "{";
  begin_varname._M_len = 1;
  end_varname._M_str = "}";
  end_varname._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname,end_varname,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  return;
}

Assistant:

void ImmutablePrimitiveFieldLiteGenerator::GenerateInterfaceMembers(
    io::Printer* printer) const {
  if (descriptor_->has_presence()) {
    WriteFieldAccessorDocComment(printer, descriptor_, HAZZER,
                                 context_->options());
    printer->Print(variables_,
                   "$deprecation$boolean has$capitalized_name$();\n");
  }
  WriteFieldAccessorDocComment(printer, descriptor_, GETTER,
                               context_->options());
  printer->Print(variables_,
                 "$deprecation$$type$ ${$get$capitalized_name$$}$();\n");
  printer->Annotate("{", "}", descriptor_);
}